

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O3

void __thiscall
ZAP::ArchiveBuilder::getFileMap
          (ArchiveBuilder *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->files)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)map,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var1 + 2),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void ArchiveBuilder::getFileMap(std::map<std::string,std::string> &map) const
	{
		for (const Entry &entry : files)
		{
			map.emplace(entry.virtual_path, entry.real_path);
		}
	}